

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O0

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindShowQuery(Binder *this,ShowRef *ref)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  idx_t iVar6;
  pointer pLVar7;
  Binder *in_RSI;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> in_RDI;
  BaseTableColumnInfo BVar8;
  templated_unique_single_t show;
  value_type type;
  value_type *alias;
  idx_t row_index;
  BaseTableColumnInfo result;
  idx_t column_idx;
  ColumnDataAppendState append_state;
  templated_unique_single_t collection;
  DataChunk output;
  vector<duckdb::LogicalType,_true> return_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  BoundStatement plan;
  shared_ptr<duckdb::Binder,_true> child_binder;
  Value *in_stack_fffffffffffff818;
  Binder *in_stack_fffffffffffff820;
  ColumnDataAppendState *this_00;
  iterator in_stack_fffffffffffff828;
  allocator *paVar9;
  DataChunk *in_stack_fffffffffffff830;
  ColumnDefinition *in_stack_fffffffffffff838;
  TableCatalogEntry *in_stack_fffffffffffff840;
  unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
  *in_stack_fffffffffffff858;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff860;
  ClientContext *in_stack_fffffffffffff868;
  ClientContext *in_stack_fffffffffffff870;
  ClientContext *in_stack_fffffffffffff878;
  ClientContext *in_stack_fffffffffffff880;
  ClientContext *in_stack_fffffffffffff888;
  string *in_stack_fffffffffffff898;
  Value *in_stack_fffffffffffff8a0;
  BinderType in_stack_fffffffffffff8bf;
  ClientContext *in_stack_fffffffffffff8c0;
  optional_ptr<duckdb::Binder,_true> in_stack_fffffffffffff8c8;
  string *in_stack_fffffffffffff8d0;
  idx_t in_stack_fffffffffffff8d8;
  BindContext *in_stack_fffffffffffff8e0;
  DataChunk *in_stack_fffffffffffff900;
  ColumnDefinition *in_stack_fffffffffffff908;
  ColumnDefinition *in_stack_fffffffffffff910;
  QueryNode *in_stack_fffffffffffff970;
  undefined1 ***pppuVar10;
  Binder *in_stack_fffffffffffff978;
  undefined1 ***pppuVar11;
  string *local_668;
  allocator local_5b1;
  string local_5b0 [32];
  idx_t local_590;
  string local_438 [96];
  string local_3d8 [120];
  string local_360 [96];
  DataChunk *local_300;
  ClientContext *local_2f8;
  BaseTableColumnInfo local_2f0;
  ulong local_2e0;
  DataChunk local_278;
  undefined1 **local_230;
  undefined8 *local_228 [3];
  undefined1 local_210 [24];
  undefined1 local_1f8 [24];
  undefined1 local_1e0 [8];
  LogicalType *in_stack_fffffffffffffe28;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [24];
  undefined1 **local_198;
  undefined8 local_190;
  undefined1 local_16f;
  allocator local_16e;
  allocator local_16d;
  allocator local_16c;
  allocator local_16b;
  allocator local_16a;
  allocator local_169;
  string *local_168;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string *local_a0;
  undefined8 local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60 [2];
  optional_ptr<duckdb::Binder,_true> local_30 [6];
  
  optional_ptr<duckdb::Binder,_true>::optional_ptr(local_30,in_RSI);
  CreateBinder(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8bf);
  shared_ptr<duckdb::Binder,_true>::operator->
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffff820);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             in_stack_fffffffffffff820);
  Bind(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  local_16f = 1;
  local_168 = local_160;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_160,"column_name",&local_169);
  local_168 = local_140;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_140,"column_type",&local_16a);
  local_168 = local_120;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_120,"null",&local_16b);
  local_168 = local_100;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_100,"key",&local_16c);
  local_168 = local_e0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e0,"default",&local_16d);
  local_168 = local_c0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_c0,"extra",&local_16e);
  local_16f = 0;
  local_a0 = local_160;
  local_98 = 6;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0xe22ea9);
  iVar1._M_len = (size_type)in_stack_fffffffffffff830;
  iVar1._M_array = in_stack_fffffffffffff828;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffff820,iVar1,(allocator_type *)in_stack_fffffffffffff818);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0xe22edd);
  local_668 = (string *)&local_a0;
  do {
    local_668 = local_668 + -0x20;
    ::std::__cxx11::string::~string(local_668);
  } while (local_668 != local_160);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_16e);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_16d);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_16c);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_16b);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_16a);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_230 = (undefined1 **)local_228;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffff840,
             (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
  local_230 = (undefined1 **)local_210;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffff840,
             (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
  local_230 = (undefined1 **)local_1f8;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffff840,
             (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
  local_230 = (undefined1 **)local_1e0;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffff840,
             (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
  local_230 = (undefined1 **)local_1c8;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffff840,
             (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
  local_230 = (undefined1 **)local_1b0;
  LogicalType::LogicalType
            ((LogicalType *)in_stack_fffffffffffff840,
             (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
  local_198 = (undefined1 **)local_228;
  local_190 = 6;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe23058);
  iVar2._M_len = (size_type)in_stack_fffffffffffff830;
  iVar2._M_array = (iterator)in_stack_fffffffffffff828;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff820,iVar2,
             (allocator_type *)in_stack_fffffffffffff818);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe2308c);
  pppuVar10 = (undefined1 ***)local_228;
  pppuVar11 = &local_198;
  do {
    pppuVar11 = pppuVar11 + -3;
    LogicalType::~LogicalType((LogicalType *)0xe230c3);
  } while (pppuVar11 != pppuVar10);
  DataChunk::DataChunk((DataChunk *)in_stack_fffffffffffff820);
  Allocator::Get((ClientContext *)0xe23100);
  DataChunk::Initialize
            ((DataChunk *)in_stack_fffffffffffff880,(Allocator *)in_stack_fffffffffffff878,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff870,
             (idx_t)in_stack_fffffffffffff868);
  make_uniq<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            (in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ColumnDataAppendState::ColumnDataAppendState((ColumnDataAppendState *)in_stack_fffffffffffff820);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)in_stack_fffffffffffff820);
  ColumnDataCollection::InitializeAppend
            ((ColumnDataCollection *)in_stack_fffffffffffff840,
             (ColumnDataAppendState *)in_stack_fffffffffffff838);
  local_2e0 = 0;
  while( true ) {
    uVar3 = local_2e0;
    sVar5 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(local_60)
    ;
    if (sVar5 <= uVar3) break;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffff820);
    BVar8 = FindBaseTableColumn((LogicalOperator *)in_stack_fffffffffffff880,
                                (idx_t)in_stack_fffffffffffff878);
    local_2f0 = BVar8;
    local_2f8 = (ClientContext *)DataChunk::size(&local_278);
    local_300 = (DataChunk *)
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)in_stack_fffffffffffff820,(size_type)in_stack_fffffffffffff818);
    bVar4 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_2f0);
    if (bVar4) {
      optional_ptr<duckdb::TableCatalogEntry,_true>::operator*
                ((optional_ptr<duckdb::TableCatalogEntry,_true> *)in_stack_fffffffffffff820);
      in_stack_fffffffffffff910 =
           optional_ptr<const_duckdb::ColumnDefinition,_true>::operator*
                     ((optional_ptr<const_duckdb::ColumnDefinition,_true> *)
                      in_stack_fffffffffffff820);
      PragmaTableInfo::GetColumnInfo
                (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                 (idx_t)in_stack_fffffffffffff828);
      in_stack_fffffffffffff900 = local_300;
      in_stack_fffffffffffff908 =
           optional_ptr<const_duckdb::ColumnDefinition,_true>::operator->
                     ((optional_ptr<const_duckdb::ColumnDefinition,_true> *)
                      in_stack_fffffffffffff820);
      ColumnDefinition::Name_abi_cxx11_(in_stack_fffffffffffff908);
      bVar4 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff820,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff818);
      if (bVar4) {
        ::std::__cxx11::string::string(local_360,(string *)local_300);
        Value::Value(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
        DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                            (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
        Value::~Value((Value *)in_stack_fffffffffffff820);
        ::std::__cxx11::string::~string(local_360);
      }
    }
    else {
      in_stack_fffffffffffff898 =
           (string *)
           vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff820,
                      (size_type)in_stack_fffffffffffff818);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff820,&in_stack_fffffffffffff818->type_);
      ::std::__cxx11::string::string(local_3d8,(string *)local_300);
      Value::Value(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                          (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      Value::~Value((Value *)in_stack_fffffffffffff820);
      ::std::__cxx11::string::~string(local_3d8);
      in_stack_fffffffffffff888 = local_2f8;
      LogicalType::ToString_abi_cxx11_(in_stack_fffffffffffffe28);
      Value::Value(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                          (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      Value::~Value((Value *)in_stack_fffffffffffff820);
      ::std::__cxx11::string::~string(local_438);
      in_stack_fffffffffffff880 = local_2f8;
      Value::Value((Value *)in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                          (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      Value::~Value((Value *)in_stack_fffffffffffff820);
      in_stack_fffffffffffff878 = local_2f8;
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff840,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
      Value::Value((Value *)in_stack_fffffffffffff830,(LogicalType *)in_stack_fffffffffffff828);
      DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                          (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      Value::~Value((Value *)in_stack_fffffffffffff820);
      LogicalType::~LogicalType((LogicalType *)0xe23913);
      in_stack_fffffffffffff870 = local_2f8;
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff840,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
      Value::Value((Value *)in_stack_fffffffffffff830,(LogicalType *)in_stack_fffffffffffff828);
      DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                          (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      Value::~Value((Value *)in_stack_fffffffffffff820);
      LogicalType::~LogicalType((LogicalType *)0xe23986);
      in_stack_fffffffffffff868 = local_2f8;
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffff840,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffff838 >> 0x38));
      Value::Value((Value *)in_stack_fffffffffffff830,(LogicalType *)in_stack_fffffffffffff828);
      DataChunk::SetValue(in_stack_fffffffffffff830,(idx_t)in_stack_fffffffffffff828,
                          (idx_t)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      Value::~Value((Value *)in_stack_fffffffffffff820);
      LogicalType::~LogicalType((LogicalType *)0xe239f9);
      LogicalType::~LogicalType((LogicalType *)0xe23a06);
    }
    iVar6 = DataChunk::size(&local_278);
    DataChunk::SetCardinality(&local_278,iVar6 + 1);
    in_stack_fffffffffffff858 =
         (unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
          *)DataChunk::size(&local_278);
    if (in_stack_fffffffffffff858 ==
        (unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
         *)0x800) {
      unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
      ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    *)in_stack_fffffffffffff820);
      ColumnDataCollection::Append
                ((ColumnDataCollection *)in_stack_fffffffffffff910,
                 (ColumnDataAppendState *)in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      DataChunk::Reset((DataChunk *)in_stack_fffffffffffff880);
    }
    local_2e0 = local_2e0 + 1;
  }
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)in_stack_fffffffffffff820);
  ColumnDataCollection::Append
            ((ColumnDataCollection *)in_stack_fffffffffffff910,
             (ColumnDataAppendState *)in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  local_590 = GenerateTableIndex(in_stack_fffffffffffff820);
  make_uniq<duckdb::LogicalColumnDataGet,unsigned_long,duckdb::vector<duckdb::LogicalType,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
            ((unsigned_long *)in_stack_fffffffffffff888,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff880,
             (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              *)in_stack_fffffffffffff878);
  pLVar7 = unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
           ::operator->((unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
                         *)in_stack_fffffffffffff820);
  this_00 = (ColumnDataAppendState *)pLVar7->table_index;
  paVar9 = &local_5b1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_5b0,"__show_select",paVar9);
  BindContext::AddGenericBinding
            (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffff8c8.ptr,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff8c0);
  ::std::__cxx11::string::~string(local_5b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  make_uniq<duckdb::BoundTableFunction,duckdb::unique_ptr<duckdb::LogicalColumnDataGet,std::default_delete<duckdb::LogicalColumnDataGet>,true>>
            (in_stack_fffffffffffff858);
  unique_ptr<duckdb::BoundTableRef,std::default_delete<duckdb::BoundTableRef>,true>::
  unique_ptr<duckdb::BoundTableFunction,std::default_delete<std::unique_ptr<duckdb::BoundTableRef,std::default_delete<duckdb::BoundTableRef>>>,void>
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             this_00,(unique_ptr<duckdb::BoundTableFunction,_std::default_delete<duckdb::BoundTableFunction>_>
                      *)in_stack_fffffffffffff818);
  unique_ptr<duckdb::BoundTableFunction,_std::default_delete<duckdb::BoundTableFunction>,_true>::
  ~unique_ptr((unique_ptr<duckdb::BoundTableFunction,_std::default_delete<duckdb::BoundTableFunction>,_true>
               *)0xe23dbf);
  unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
  ::~unique_ptr((unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
                 *)0xe23dcc);
  ColumnDataAppendState::~ColumnDataAppendState(this_00);
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 *)0xe23de6);
  DataChunk::~DataChunk((DataChunk *)this_00);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe23e00);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0xe23e0d);
  BoundStatement::~BoundStatement((BoundStatement *)this_00);
  shared_ptr<duckdb::Binder,_true>::~shared_ptr((shared_ptr<duckdb::Binder,_true> *)0xe23e27);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (__uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
         .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindShowQuery(ShowRef &ref) {
	// bind the child plan of the DESCRIBE statement
	auto child_binder = Binder::CreateBinder(context, this);
	auto plan = child_binder->Bind(*ref.query);

	// construct a column data collection with the result
	vector<string> return_names = {"column_name", "column_type", "null", "key", "default", "extra"};
	vector<LogicalType> return_types = {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR,
	                                    LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR};
	DataChunk output;
	output.Initialize(Allocator::Get(context), return_types);

	auto collection = make_uniq<ColumnDataCollection>(context, return_types);
	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);
	for (idx_t column_idx = 0; column_idx < plan.types.size(); column_idx++) {
		// check if we can trace the column to a base table so that we can figure out constraint information
		auto result = FindBaseTableColumn(*plan.plan, column_idx);
		idx_t row_index = output.size();
		auto &alias = plan.names[column_idx];
		if (result.table) {
			// we can! emit the information from the base table directly
			PragmaTableInfo::GetColumnInfo(*result.table, *result.column, output, row_index);
			// Override the base column name with the alias if one is specified.
			if (alias != result.column->Name()) {
				output.SetValue(0, row_index, Value(alias));
			}
		} else {
			// we cannot - read the type/name from the plan instead
			auto type = plan.types[column_idx];

			// "name", TypeId::VARCHAR
			output.SetValue(0, row_index, Value(alias));
			// "type", TypeId::VARCHAR
			output.SetValue(1, row_index, Value(type.ToString()));
			// "null", TypeId::VARCHAR
			output.SetValue(2, row_index, Value("YES"));
			// "pk", TypeId::BOOL
			output.SetValue(3, row_index, Value());
			// "dflt_value", TypeId::VARCHAR
			output.SetValue(4, row_index, Value());
			// "extra", TypeId::VARCHAR
			output.SetValue(5, row_index, Value());
		}

		output.SetCardinality(output.size() + 1);
		if (output.size() == STANDARD_VECTOR_SIZE) {
			collection->Append(append_state, output);
			output.Reset();
		}
	}
	collection->Append(append_state, output);

	auto show = make_uniq<LogicalColumnDataGet>(GenerateTableIndex(), return_types, std::move(collection));
	bind_context.AddGenericBinding(show->table_index, "__show_select", return_names, return_types);
	return make_uniq<BoundTableFunction>(std::move(show));
}